

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O2

uint64_t axl::io::copyFile(File *srcFile,File *dstFile,uint64_t size)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Module *pMVar4;
  void *src;
  void *dst;
  int __fd;
  uint64_t offset;
  void *size_00;
  Mapping dstMapping;
  Mapping srcMapping;
  
  pMVar4 = g::getModule();
  uVar1 = (pMVar4->m_systemInfo).m_mappingAlignFactor;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  if (size == 0xffffffffffffffff) {
    size = psx::File::getSize(&srcFile->m_file);
  }
  src = (void *)size;
  bVar3 = psx::File::setSize(&dstFile->m_file,size);
  if (bVar3) {
    size_00 = (void *)((uVar1 - SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) % auVar2,0)) +
                      0x10000);
    srcMapping.m_p = (void *)0x0;
    srcMapping.m_size = 0;
    dstMapping.m_p = (void *)0x0;
    dstMapping.m_size = 0;
    offset = 0;
    for (; __fd = (int)src, (void *)size != (void *)0x0; size = size - (long)size_00) {
      if (size <= size_00) {
        size_00 = (void *)size;
      }
      src = psx::Mapping::map(&srcMapping,(void *)0x0,(size_t)size_00,1,1,
                              (srcFile->m_file).
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                              m_h,offset);
      dst = psx::Mapping::map(&dstMapping,(void *)0x0,(size_t)size_00,3,1,
                              (dstFile->m_file).
                              super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.
                              m_h,offset);
      if ((src == (void *)0x0) || (dst == (void *)0x0)) {
        offset = 0xffffffffffffffff;
        goto LAB_00144f33;
      }
      __wrap_memcpy(dst,src,(size_t)size_00);
      offset = offset + (long)size_00;
    }
    psx::Mapping::close(&srcMapping,__fd);
    psx::Mapping::close(&dstMapping,__fd);
LAB_00144f33:
    psx::Mapping::~Mapping(&dstMapping);
    psx::Mapping::~Mapping(&srcMapping);
  }
  else {
    offset = 0xffffffffffffffff;
  }
  return offset;
}

Assistant:

uint64_t
copyFile(
	const io::File* srcFile,
	io::File* dstFile,
	uint64_t size
) {
	enum {
		BaseBlockSize = 64 * 1024, // 64K
	};

	bool result;

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size_t blockSize = BaseBlockSize + systemInfo->m_mappingAlignFactor - BaseBlockSize % systemInfo->m_mappingAlignFactor;

	uint64_t offset = 0;

	if (size == -1)
		size = srcFile->getSize();

	result = dstFile->setSize(size);
	if (!result)
		return -1;

#if (_AXL_OS_WIN)
	win::Mapping srcMapping;
	win::Mapping dstMapping;
	win::MappedView srcView;
	win::MappedView dstView;

	result =
		srcMapping.create(srcFile->m_file, NULL, PAGE_READONLY, size) &&
		dstMapping.create(dstFile->m_file, NULL, PAGE_READWRITE, size);

	if (!result)
		return -1;

	while (size) {
		if (blockSize > size)
			blockSize = (size_t)size;

		const void* src = srcView.view(srcMapping, FILE_MAP_READ, offset, blockSize);
		void* dst = dstView.view(dstMapping, FILE_MAP_READ | FILE_MAP_WRITE, offset, blockSize);

		if (!src || !dst)
			return -1;

		memcpy(dst, src, blockSize);

		offset += blockSize;
		size -= blockSize;
	}

	srcMapping.close();
	dstMapping.close();
	srcView.close();
	dstView.close();
#else
	psx::Mapping srcMapping;
	psx::Mapping dstMapping;

	while (size) {
		if (blockSize > size)
			blockSize = (size_t)size;

		const void* src = srcMapping.map(NULL, blockSize, PROT_READ, MAP_SHARED, srcFile->m_file, offset);
		void* dst = dstMapping.map(NULL, blockSize, PROT_READ | PROT_WRITE, MAP_SHARED, dstFile->m_file, offset);

		if (!src || !dst)
			return -1;

		memcpy(dst, src, blockSize);

		offset += blockSize;
		size -= blockSize;
	}

	srcMapping.close();
	dstMapping.close();
#endif

	return offset;
}